

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O0

void ENUMS_EQUAL_INT_TEXTWithScopedIntEnumTestMethod_(void)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_40 [2];
  SimpleString local_20;
  undefined4 local_10;
  undefined4 local_c;
  int actual_underlying_value;
  int expected_underlying_value;
  
  local_c = 1;
  local_10 = 0;
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_20);
  pcVar2 = SimpleString::asCharString(&local_20);
  StringFrom((int)local_40);
  pcVar3 = SimpleString::asCharString(local_40);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,"Failed because it failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4a9,pTVar4);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

static void ENUMS_EQUAL_INT_TEXTWithScopedIntEnumTestMethod_()
{
    ENUMS_EQUAL_INT_TEXT(ScopedIntEnum::B, ScopedIntEnum::A, "Failed because it failed");
}